

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

bool Interpreter::Equals(string *a,string *b)

{
  __type _Var1;
  int iVar2;
  size_type sVar3;
  string aa;
  string bb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_60,(string *)a);
  std::__cxx11::string::string((string *)&local_40,(string *)b);
  for (sVar3 = 0; local_60._M_string_length != sVar3; sVar3 = sVar3 + 1) {
    iVar2 = tolower((int)local_60._M_dataplus._M_p[sVar3]);
    local_60._M_dataplus._M_p[sVar3] = (char)iVar2;
  }
  for (sVar3 = 0; local_40._M_string_length != sVar3; sVar3 = sVar3 + 1) {
    iVar2 = tolower((int)local_40._M_dataplus._M_p[sVar3]);
    local_40._M_dataplus._M_p[sVar3] = (char)iVar2;
  }
  _Var1 = std::operator==(&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return _Var1;
}

Assistant:

bool Interpreter::Equals(const std::string& a, const std::string& b)
{
    std::string aa = a, bb = b;
    std::transform(aa.begin(), aa.end(), aa.begin(), ::tolower);
    std::transform(bb.begin(), bb.end(), bb.begin(), ::tolower);
    return aa == bb;
}